

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O3

void duckdb::roaring::AppendRun(ContainerCompressionState *state,bool null,uint16_t amount)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  
  uVar1 = state->appended_count;
  uVar2 = state->run_idx;
  uVar3 = (ulong)uVar2;
  if (((uVar1 != 0 & uVar2 < 0x7c & ~null) == 1) && (state->last_is_null != null)) {
    if (uVar2 < 4) {
      state->runs[uVar3].length = uVar1 + ~state->runs[uVar3].start;
    }
    state->compressed_runs[uVar3 * 2 + 1] = (uint8_t)uVar1;
    state->run_counts[uVar1 >> 8] = state->run_counts[uVar1 >> 8] + '\x01';
    state->run_idx = state->run_idx + 1;
    return;
  }
  if ((null && uVar2 < 0x7c) && ((uVar1 == 0 || (state->last_is_null == false)))) {
    if (uVar2 < 4) {
      state->runs[uVar3].start = uVar1;
    }
    state->compressed_runs[uVar3 * 2] = (uint8_t)uVar1;
    state->run_counts[uVar1 >> 8] = state->run_counts[uVar1 >> 8] + '\x01';
    return;
  }
  return;
}

Assistant:

inline void AppendRun(ContainerCompressionState &state, bool null, uint16_t amount) {
	// Adjust the run
	auto run_idx = state.run_idx;
	auto appended_count = state.appended_count;
	if (!null && run_idx < MAX_RUN_IDX && appended_count && (null != state.last_is_null)) {
		if (run_idx < COMPRESSED_RUN_THRESHOLD) {
			auto &last_run = state.runs[run_idx];
			// End the last run
			last_run.length = (appended_count - last_run.start) - 1;
		}
		state.compressed_runs[(run_idx * 2) + 1] = static_cast<uint8_t>(appended_count & (COMPRESSED_SEGMENT_SIZE - 1));
		state.run_counts[appended_count >> COMPRESSED_SEGMENT_SHIFT_AMOUNT]++;
		state.run_idx++;
	} else if (null && run_idx < MAX_RUN_IDX && (!appended_count || null != state.last_is_null)) {
		if (run_idx < COMPRESSED_RUN_THRESHOLD) {
			auto &current_run = state.runs[run_idx];
			// Initialize a new run
			current_run.start = appended_count;
		}
		state.compressed_runs[(run_idx * 2) + 0] = static_cast<uint8_t>(appended_count & (COMPRESSED_SEGMENT_SIZE - 1));
		state.run_counts[appended_count >> COMPRESSED_SEGMENT_SHIFT_AMOUNT]++;
	}
}